

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_m2mf.cc
# Opt level: O1

bool __thiscall hwtest::pgraph::anon_unknown_8::MthdM2mfFormat::is_valid_val(MthdM2mfFormat *this)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = (this->super_SingleMthdTest).super_MthdTest.val;
  if (((((uVar1 & 7) < 5) && ((0x16U >> (uVar1 & 7) & 1) != 0)) &&
      (uVar2 = uVar1 >> 8 & 7, uVar2 < 5)) &&
     (((0x16U >> uVar2 & 1) != 0 &&
      ((uVar1 < 0x800 ||
       ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test.
        chipset.chipset < 5)))))) {
    return (uVar1 & 0xf8) == 0;
  }
  return false;
}

Assistant:

bool is_valid_val() override {
		int a = extr(val, 0, 3);
		int b = extr(val, 8, 3);
		if (a != 1 && a != 2 && a != 4)
			return false;
		if (b != 1 && b != 2 && b != 4)
			return false;
		if (chipset.chipset >= 5 && val & ~0x7ff)
			return false;
		return !(val & 0xf8);
	}